

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_common.c
# Opt level: O0

_Bool mfb_set_viewport_best_fit(mfb_window *window,uint old_width,uint old_height)

{
  int iVar1;
  int iVar2;
  uint offset_x_00;
  uint offset_y_00;
  uint in_EDX;
  uint in_ESI;
  mfb_window *in_RDI;
  uint offset_y;
  uint offset_x;
  uint finalHeight;
  uint finalWidth;
  float scale_y;
  float scale_x;
  uint new_height;
  uint new_width;
  SWindowData *window_data;
  uint in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  float local_30;
  float local_2c;
  uint local_28;
  uint local_24;
  _Bool local_1;
  
  if (in_RDI == (mfb_window *)0x0) {
    local_1 = false;
  }
  else {
    local_24 = *(uint *)(in_RDI + 0x50);
    local_28 = *(uint *)(in_RDI + 0x54);
    local_2c = (float)local_24 / (float)in_ESI;
    if ((float)local_28 / (float)in_EDX <= local_2c) {
      local_2c = (float)local_28 / (float)in_EDX;
    }
    iVar1 = (int)(long)((float)in_ESI * local_2c + 0.5);
    iVar2 = (int)(long)((float)in_EDX * local_2c + 0.5);
    offset_x_00 = local_24 - iVar1 >> 1;
    offset_y_00 = local_28 - iVar2 >> 1;
    local_30 = local_2c;
    mfb_get_monitor_scale(in_RDI,&local_2c,&local_30);
    local_1 = mfb_set_viewport((mfb_window *)CONCAT44(iVar1,iVar2),offset_x_00,offset_y_00,
                               in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  }
  return local_1;
}

Assistant:

bool
mfb_set_viewport_best_fit(struct mfb_window *window, unsigned old_width, unsigned old_height) {
    if(window != 0x0) {
        SWindowData *window_data = (SWindowData *) window;

        unsigned new_width  = window_data->window_width;
        unsigned new_height = window_data->window_height;

        float scale_x = new_width  / (float) old_width;
        float scale_y = new_height / (float) old_height;
        if(scale_x >= scale_y)
            scale_x = scale_y;
        else
            scale_y = scale_x;

        unsigned finalWidth  = (old_width  * scale_x) + 0.5f;
        unsigned finalHeight = (old_height * scale_y) + 0.5f;

        unsigned offset_x = (new_width  - finalWidth)  >> 1;
        unsigned offset_y = (new_height - finalHeight) >> 1;

        mfb_get_monitor_scale(window, &scale_x, &scale_y);
        return mfb_set_viewport(window, offset_x / scale_x, offset_y / scale_y, finalWidth / scale_x, finalHeight / scale_y);
    }

    return false;
}